

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Lodtalk::MethodSemanticAnalysis::inlineBlock
          (MethodSemanticAnalysis *this,Node *node,int argumentCount)

{
  uint uVar1;
  size_t sVar2;
  BlockExpression *block;
  int argumentCount_local;
  Node *node_local;
  MethodSemanticAnalysis *this_local;
  
  uVar1 = (*node->_vptr_Node[5])();
  if ((uVar1 & 1) != 0) {
    if ((-1 < argumentCount) &&
       (sVar2 = AST::FunctionalNode::getArgumentCount((FunctionalNode *)node),
       (int)sVar2 != argumentCount)) {
      AbstractASTVisitor::error
                ((AbstractASTVisitor *)this,node,"this block has an invalid number of parameters.");
    }
    if (node != (Node *)0x0) {
      (*node->_vptr_Node[10])(node,1);
    }
  }
  (*node->_vptr_Node[2])(node,this);
  return;
}

Assistant:

void MethodSemanticAnalysis::inlineBlock(Node *node, int argumentCount)
{
    if(node->isBlockExpression())
    {
        auto block = reinterpret_cast<BlockExpression*> (node);
        if(argumentCount >= 0 && (int)block->getArgumentCount() != argumentCount)
            error(node, "this block has an invalid number of parameters.");

        if(block)
            block->setInlined(true);
    }

    node->acceptVisitor(this);
}